

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::CumulativeReporterBase
          (CumulativeReporterBase<Catch::JunitReporter> *this,ReporterConfig *_config)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  initializer_list<Catch::Verbosity> __l;
  allocator_type local_89 [9];
  ReusableStringStream local_80;
  Verbosity local_70 [4];
  _Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  local_60;
  
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__CumulativeReporterBase_00198250;
  (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_config->m_fullConfig).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var2 = (_config->m_fullConfig).
           super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->stream = _config->m_stream;
  memset(&this->m_assertions,0,0xb2);
  local_70[0] = Normal;
  __l._M_len = 1;
  __l._M_array = local_70;
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::set((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *)
        &local_60,__l,(less<Catch::Verbosity> *)&local_80,local_89);
  iVar3 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x14])();
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_parent !=
         (_Rb_tree_header *)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&(local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
           [(int)*(size_t *)(local_60._M_impl.super__Rb_tree_header._M_header._M_parent + 1) < iVar3
           ]) {
    if (iVar3 <= (int)*(size_t *)(local_60._M_impl.super__Rb_tree_header._M_header._M_parent + 1)) {
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
  }
  p_Var5 = p_Var1;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = (_Rb_tree_header *)p_Var4, iVar3 < (int)((_Rb_tree_header *)p_Var4)->_M_node_count))
  {
    p_Var5 = p_Var1;
  }
  clara::std::
  _Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~_Rb_tree(&local_60);
  if (p_Var5 != p_Var1) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_80);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_80.m_oss,"Verbosity level not supported by this reporter",0x2e);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error((domain_error *)local_70,(string *)&local_60);
  throw_exception<std::domain_error>((domain_error *)local_70);
}

Assistant:

CumulativeReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }